

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::keyPressEvent(QPlainTextEdit *this,QKeyEvent *e)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *pQVar1;
  QScrollBar *pQVar2;
  char cVar3;
  TextInteractionFlags TVar4;
  uint uVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  MoveMode moveMode;
  MoveOperation op;
  SliderAction SVar9;
  StandardKey SVar10;
  long in_FS_OFFSET;
  qreal qVar11;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  TVar4 = QWidgetTextControl::textInteractionFlags((QWidgetTextControl *)this_00->control);
  SVar10 = (StandardKey)e;
  if ((((uint)TVar4.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
              super_QFlagsStorage<Qt::TextInteractionFlag>.i & 2) != 0) && (e != (QKeyEvent *)0x0))
  {
    cVar3 = QKeyEvent::matches(SVar10);
    if (cVar3 != '\0') {
      e[0xc] = (QKeyEvent)0x1;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_004a14d4;
      op = Up;
LAB_004a122c:
      moveMode = KeepAnchor;
      goto LAB_004a12b6;
    }
    if (e != (QKeyEvent *)0x0) {
      cVar3 = QKeyEvent::matches(SVar10);
      if (cVar3 != '\0') {
        e[0xc] = (QKeyEvent)0x1;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_004a14d4;
        op = Down;
        goto LAB_004a122c;
      }
    }
  }
  if ((((uint)TVar4.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
              super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x12) != 0) &&
     (e != (QKeyEvent *)0x0)) {
    cVar3 = QKeyEvent::matches(SVar10);
    if (cVar3 != '\0') {
      e[0xc] = (QKeyEvent)0x1;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_004a14d4;
      op = Up;
LAB_004a12b4:
      moveMode = MoveAnchor;
LAB_004a12b6:
      QPlainTextEditPrivate::pageUpDown(this_00,op,moveMode,true);
      return;
    }
    if (e != (QKeyEvent *)0x0) {
      cVar3 = QKeyEvent::matches(SVar10);
      if (cVar3 != '\0') {
        e[0xc] = (QKeyEvent)0x1;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_004a14d4;
        op = Down;
        goto LAB_004a12b4;
      }
    }
  }
  if (((uint)TVar4.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0) {
    if (*(int *)(e + 0x40) == 0x20) {
      e[0xc] = (QKeyEvent)0x1;
      uVar5 = QKeyEvent::modifiers();
      if ((uVar5 >> 0x19 & 1) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          SVar9 = SliderPageStepAdd;
LAB_004a1411:
          QAbstractSlider::triggerAction
                    (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,
                     SVar9);
          return;
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        SVar9 = SliderPageStepSub;
        goto LAB_004a1411;
      }
      goto LAB_004a14d4;
    }
    pQVar1 = this_00->control;
    LVar6 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    pQVar2 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar6 == RightToLeft) {
      iVar7 = QAbstractSlider::maximum(&pQVar2->super_QAbstractSlider);
      iVar8 = QAbstractSlider::value
                        (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider)
      ;
      iVar7 = iVar7 - iVar8;
    }
    else {
      iVar7 = QAbstractSlider::value(&pQVar2->super_QAbstractSlider);
    }
    qVar11 = QPlainTextEditPrivate::verticalOffset
                       (this_00,this_00->control->topBlock,this_00->topLine);
    local_40.yp = qVar11 + this_00->topLineFracture;
    local_40.xp = (double)iVar7;
    QWidgetTextControl::processEvent
              ((QWidgetTextControl *)pQVar1,(QEvent *)e,&local_40,
               (this_00->super_QAbstractScrollAreaPrivate).viewport);
    if (e[0xc] == (QKeyEvent)0x0) {
      iVar7 = QKeyEvent::modifiers();
      if (iVar7 == 0) {
        if (*(int *)(e + 0x40) == 0x1000010) {
          SVar9 = SliderToMinimum;
        }
        else {
          if (*(int *)(e + 0x40) != 0x1000011) goto LAB_004a14b9;
          SVar9 = SliderToMaximum;
        }
        QAbstractSlider::triggerAction
                  (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,SVar9)
        ;
        e[0xc] = (QKeyEvent)0x1;
      }
    }
LAB_004a14b9:
    if (e[0xc] == (QKeyEvent)0x0) {
      QAbstractScrollArea::keyPressEvent((QAbstractScrollArea *)this,e);
    }
  }
  else {
    pQVar1 = this_00->control;
    LVar6 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    pQVar2 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar6 == RightToLeft) {
      iVar7 = QAbstractSlider::maximum(&pQVar2->super_QAbstractSlider);
      iVar8 = QAbstractSlider::value
                        (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider)
      ;
      iVar7 = iVar7 - iVar8;
    }
    else {
      iVar7 = QAbstractSlider::value(&pQVar2->super_QAbstractSlider);
    }
    qVar11 = QPlainTextEditPrivate::verticalOffset
                       (this_00,this_00->control->topBlock,this_00->topLine);
    local_40.yp = qVar11 + this_00->topLineFracture;
    local_40.xp = (double)iVar7;
    QWidgetTextControl::processEvent
              ((QWidgetTextControl *)pQVar1,(QEvent *)e,&local_40,
               (this_00->super_QAbstractScrollAreaPrivate).viewport);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_004a14d4:
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPlainTextEdit);

#ifdef QT_KEYPAD_NAVIGATION
    switch (e->key()) {
        case Qt::Key_Select:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!(d->control->textInteractionFlags() & Qt::LinksAccessibleByKeyboard))
                    setEditFocus(!hasEditFocus());
                else {
                    if (!hasEditFocus())
                        setEditFocus(true);
                    else {
                        QTextCursor cursor = d->control->textCursor();
                        QTextCharFormat charFmt = cursor.charFormat();
                        if (!cursor.hasSelection() || charFmt.anchorHref().isEmpty()) {
                            setEditFocus(false);
                        }
                    }
                }
            }
            break;
        case Qt::Key_Back:
        case Qt::Key_No:
            if (!QApplicationPrivate::keypadNavigationEnabled() || !hasEditFocus()) {
                e->ignore();
                return;
            }
            break;
        default:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!hasEditFocus() && !(e->modifiers() & Qt::ControlModifier)) {
                    if (e->text()[0].isPrint()) {
                        setEditFocus(true);
                        clear();
                    } else {
                        e->ignore();
                        return;
                    }
                }
            }
            break;
    }
#endif

#ifndef QT_NO_SHORTCUT

    Qt::TextInteractionFlags tif = d->control->textInteractionFlags();

    if (tif & Qt::TextSelectableByKeyboard){
        if (e == QKeySequence::SelectPreviousPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Up, QTextCursor::KeepAnchor);
            return;
        } else if (e ==QKeySequence::SelectNextPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Down, QTextCursor::KeepAnchor);
            return;
        }
    }
    if (tif & (Qt::TextSelectableByKeyboard | Qt::TextEditable)) {
        if (e == QKeySequence::MoveToPreviousPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Up, QTextCursor::MoveAnchor);
            return;
        } else if (e == QKeySequence::MoveToNextPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Down, QTextCursor::MoveAnchor);
            return;
        }
    }

    if (!(tif & Qt::TextEditable)) {
        switch (e->key()) {
            case Qt::Key_Space:
                e->accept();
                if (e->modifiers() & Qt::ShiftModifier)
                    d->vbar->triggerAction(QAbstractSlider::SliderPageStepSub);
                else
                    d->vbar->triggerAction(QAbstractSlider::SliderPageStepAdd);
                break;
            default:
                d->sendControlEvent(e);
                if (!e->isAccepted() && e->modifiers() == Qt::NoModifier) {
                    if (e->key() == Qt::Key_Home) {
                        d->vbar->triggerAction(QAbstractSlider::SliderToMinimum);
                        e->accept();
                    } else if (e->key() == Qt::Key_End) {
                        d->vbar->triggerAction(QAbstractSlider::SliderToMaximum);
                        e->accept();
                    }
                }
                if (!e->isAccepted()) {
                    QAbstractScrollArea::keyPressEvent(e);
                }
        }
        return;
    }
#endif // QT_NO_SHORTCUT

    d->sendControlEvent(e);
#ifdef QT_KEYPAD_NAVIGATION
    if (!e->isAccepted()) {
        switch (e->key()) {
            case Qt::Key_Up:
            case Qt::Key_Down:
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    // Cursor position didn't change, so we want to leave
                    // these keys to change focus.
                    e->ignore();
                    return;
                }
                break;
            case Qt::Key_Left:
            case Qt::Key_Right:
                if (QApplicationPrivate::keypadNavigationEnabled()
                        && QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
                    // Same as for Key_Up and Key_Down.
                    e->ignore();
                    return;
                }
                break;
            case Qt::Key_Back:
                if (!e->isAutoRepeat()) {
                    if (QApplicationPrivate::keypadNavigationEnabled()) {
                        if (document()->isEmpty()) {
                            setEditFocus(false);
                            e->accept();
                        } else if (!d->deleteAllTimer.isActive()) {
                            e->accept();
                            d->deleteAllTimer.start(750, this);
                        }
                    } else {
                        e->ignore();
                        return;
                    }
                }
                break;
            default: break;
        }
    }
#endif
}